

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_get_factors.c
# Opt level: O0

lu_int basiclu_get_factors(lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux
                          ,lu_int *Wi,double *Wx,lu_int *rowperm,lu_int *colperm,lu_int *Lcolptr,
                          lu_int *Lrowidx,double *Lvalue_,lu_int *Ucolptr,lu_int *Urowidx,
                          double *Uvalue_)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double *in_RSI;
  lu_int *in_RDI;
  lu_int pos_1;
  lu_int put_1;
  lu_int k_1;
  lu_int j;
  lu_int *colptr_1;
  lu_int *pivotcol;
  double *col_pivot;
  double *Wvalue;
  lu_int *Windex;
  lu_int *Wend;
  lu_int *Wbegin;
  lu_int pos;
  lu_int put;
  lu_int k;
  lu_int i;
  lu_int *colptr;
  lu_int *p;
  double *Lvalue;
  lu_int *Lindex;
  lu_int *Ltbegin_p;
  lu_int *Lbegin_p;
  lu_int status;
  lu_int m;
  lu this;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  lu_int *in_stack_fffffffffffffc90;
  double *in_stack_fffffffffffffc98;
  lu_int *in_stack_fffffffffffffca0;
  lu *in_stack_fffffffffffffca8;
  double *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  int iVar4;
  undefined4 in_stack_fffffffffffffcd0;
  int iVar5;
  undefined4 in_stack_fffffffffffffcd4;
  undefined1 local_2f0 [84];
  int local_29c;
  int local_28c;
  long local_150;
  long local_140;
  long local_138;
  long local_128;
  void *local_118;
  void *local_108;
  void *local_e0;
  long local_d8;
  long local_c8;
  long local_b0;
  long local_a0;
  long local_78;
  long local_48;
  double *local_18;
  lu_int *local_10;
  lu_int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_4 = lu_load(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                    in_stack_fffffffffffffc90,
                    (double *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                    (lu_int *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                    in_stack_fffffffffffffcc0,
                    (lu_int *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                    (double *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  if (local_4 == 0) {
    if (local_28c == 0) {
      if (_pos_1 != (void *)0x0) {
        memcpy(_pos_1,local_108,(long)local_29c << 2);
      }
      if (_k_1 != (void *)0x0) {
        memcpy(_k_1,local_118,(long)local_29c << 2);
      }
      if (((colptr_1 != (lu_int *)0x0) && (pivotcol != (lu_int *)0x0)) &&
         (col_pivot != (double *)0x0)) {
        iVar4 = 0;
        for (iVar5 = 0; iVar5 < local_29c; iVar5 = iVar5 + 1) {
          colptr_1[iVar5] = iVar4;
          pivotcol[iVar4] = iVar5;
          col_pivot[iVar4] = 1.0;
          *(int *)((long)local_e0 + (long)*(int *)(local_a0 + (long)iVar5 * 4) * 4) = iVar4 + 1;
          iVar4 = (*(int *)(local_78 + (long)(iVar5 + 1) * 4) - *(int *)(local_78 + (long)iVar5 * 4)
                  ) + -1 + iVar4 + 1;
        }
        colptr_1[local_29c] = iVar4;
        for (iVar4 = 0; iVar4 < local_29c; iVar4 = iVar4 + 1) {
          iVar5 = *(int *)(local_b0 + (long)iVar4 * 4);
          while (iVar2 = *(int *)(local_150 + (long)iVar5 * 4), -1 < iVar2) {
            iVar1 = *(int *)((long)local_e0 + (long)iVar2 * 4);
            *(int *)((long)local_e0 + (long)iVar2 * 4) = iVar1 + 1;
            pivotcol[iVar1] = iVar4;
            col_pivot[iVar1] = *(double *)(local_138 + (long)iVar5 * 8);
            iVar5 = iVar5 + 1;
          }
        }
      }
      if (((Wvalue != (double *)0x0) && (Windex != (lu_int *)0x0)) && (Wend != (lu_int *)0x0)) {
        memset(local_e0,0,(long)local_29c << 2);
        for (iVar4 = 0; iVar4 < local_29c; iVar4 = iVar4 + 1) {
          for (iVar5 = *(int *)(local_d8 + (long)iVar4 * 4);
              iVar5 < *(int *)(local_c8 + (long)iVar4 * 4); iVar5 = iVar5 + 1) {
            lVar3 = (long)*(int *)(local_140 + (long)iVar5 * 4);
            *(int *)((long)local_e0 + lVar3 * 4) = *(int *)((long)local_e0 + lVar3 * 4) + 1;
          }
        }
        iVar5 = 0;
        for (iVar4 = 0; iVar4 < local_29c; iVar4 = iVar4 + 1) {
          iVar2 = *(int *)((long)local_118 + (long)iVar4 * 4);
          *(int *)((long)Wvalue + (long)iVar4 * 4) = iVar5;
          iVar1 = *(int *)((long)local_e0 + (long)iVar2 * 4) + iVar5;
          *(undefined4 *)((long)local_e0 + (long)iVar2 * 4) =
               *(undefined4 *)((long)Wvalue + (long)iVar4 * 4);
          Windex[iVar1] = iVar4;
          iVar5 = iVar1 + 1;
          *(undefined8 *)(Wend + (long)iVar1 * 2) = *(undefined8 *)(local_48 + (long)iVar2 * 8);
        }
        *(int *)((long)Wvalue + (long)local_29c * 4) = iVar5;
        for (iVar4 = 0; iVar4 < local_29c; iVar4 = iVar4 + 1) {
          iVar5 = *(int *)((long)local_118 + (long)iVar4 * 4);
          for (iVar2 = *(int *)(local_d8 + (long)iVar5 * 4);
              iVar2 < *(int *)(local_c8 + (long)iVar5 * 4); iVar2 = iVar2 + 1) {
            lVar3 = (long)*(int *)(local_140 + (long)iVar2 * 4);
            iVar1 = *(int *)((long)local_e0 + lVar3 * 4);
            *(int *)((long)local_e0 + lVar3 * 4) = iVar1 + 1;
            Windex[iVar1] = iVar4;
            *(undefined8 *)(Wend + (long)iVar1 * 2) = *(undefined8 *)(local_128 + (long)iVar2 * 8);
          }
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = lu_save(local_2f0,local_10,local_18,-2);
    }
  }
  return local_4;
}

Assistant:

lu_int basiclu_get_factors
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    lu_int rowperm[],
    lu_int colperm[],
    lu_int Lcolptr[],
    lu_int Lrowidx[],
    double Lvalue_[],
    lu_int Ucolptr[],
    lu_int Urowidx[],
    double Uvalue_[]
)
{
    struct lu this;
    lu_int m, status;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;
    if (this.nupdate != 0)
    {
        status = BASICLU_ERROR_invalid_call;
        return lu_save(&this, istore, xstore, status);
    }
    m = this.m;

    if (rowperm)
        memcpy(rowperm, this.pivotrow, m*sizeof(lu_int));
    if (colperm)
        memcpy(colperm, this.pivotcol, m*sizeof(lu_int));

    if (Lcolptr && Lrowidx && Lvalue_)
    {
        const lu_int *Lbegin_p  = this.Lbegin_p;
        const lu_int *Ltbegin_p = this.Ltbegin_p;
        const lu_int *Lindex    = this.Lindex;
        const double *Lvalue    = this.Lvalue;
        const lu_int *p         = this.p;
        lu_int *colptr          = this.iwork1; /* size m workspace */
        lu_int i, k, put, pos;

        /*
         * L[:,k] will hold the elimination factors from the k-th pivot step.
         * First set the column pointers and store the unit diagonal elements
         * at the front of each column. Then scatter each row of L' into the
         * columnwise L so that the row indices become sorted.
         */
        put = 0;
        for (k = 0; k < m; k++)
        {
            Lcolptr[k] = put;
            Lrowidx[put] = k;
            Lvalue_[put++] = 1.0;
            colptr[p[k]] = put; /* next free position in column */
            put += Lbegin_p[k+1] - Lbegin_p[k] - 1;
            /* subtract 1 because internal storage uses (-1) terminators */
        }
        Lcolptr[m] = put;
        assert(put == this.Lnz+m);

        for (k = 0; k < m; k++)
        {
            for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
            {
                put = colptr[i]++;
                Lrowidx[put] = k;
                Lvalue_[put] = Lvalue[pos];
            }
        }

        #ifndef NDEBUG
        for (k = 0; k < m; k++)
        {
            assert(colptr[p[k]] == Lcolptr[k+1]);
        }
        #endif
    }

    if (Ucolptr && Urowidx && Uvalue_)
    {
        const lu_int *Wbegin    = this.Wbegin;
        const lu_int *Wend      = this.Wend;
        const lu_int *Windex    = this.Windex;
        const double *Wvalue    = this.Wvalue;
        const double *col_pivot = this.col_pivot;
        const lu_int *pivotcol  = this.pivotcol;
        lu_int *colptr          = this.iwork1; /* size m workspace */
        lu_int j, k, put, pos;

        /*
         * U[:,k] will hold the column of B from the k-th pivot step.
         * First set the column pointers and store the pivot element at the end
         * of each column. Then scatter each row of U' into the columnwise U so
         * that the row indices become sorted.
         */
        memset(colptr, 0, m*sizeof(lu_int)); /* column counts */
        for (j = 0; j < m; j++)
        {
            for (pos = Wbegin[j]; pos < Wend[j]; pos++)
                colptr[Windex[pos]]++;
        }
        put = 0;
        for (k = 0; k < m; k++) /* set column pointers */
        {
            j = pivotcol[k];
            Ucolptr[k] = put;
            put += colptr[j];
            colptr[j] = Ucolptr[k]; /* next free position in column */
            Urowidx[put] = k;
            Uvalue_[put++] = col_pivot[j];
        }
        Ucolptr[m] = put;
        assert(put == this.Unz+m);
        for (k = 0; k < m; k++) /* scatter row k */
        {
            j = pivotcol[k];
            for (pos = Wbegin[j]; pos < Wend[j]; pos++)
            {
                put = colptr[Windex[pos]]++;
                Urowidx[put] = k;
                Uvalue_[put] = Wvalue[pos];
            }
        }

        #ifndef NDEBUG
        for (k = 0; k < m; k++) assert(colptr[pivotcol[k]] == Ucolptr[k+1]-1);
        for (k = 0; k < m; k++) assert(Urowidx[Ucolptr[k+1]-1] == k);
        #endif
    }

    return BASICLU_OK;
}